

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

void __thiscall
embree::FastAllocator::Statistics::Statistics
          (Statistics *this,FastAllocator *alloc,AllocationType atype,bool huge_pages)

{
  Block *this_00;
  Block *this_01;
  size_t sVar1;
  
  this->bytesUsed = 0;
  this->bytesFree = 0;
  this->bytesWasted = 0;
  this_00 = (alloc->usedBlocks)._M_b._M_p;
  this_01 = (alloc->freeBlocks)._M_b._M_p;
  if (this_00 != (Block *)0x0) {
    sVar1 = Block::getUsedBytes(this_00,atype,huge_pages);
    this->bytesUsed = this->bytesUsed + sVar1;
  }
  if (this_01 != (Block *)0x0) {
    sVar1 = Block::getAllocatedBytes(this_01,atype,huge_pages);
    this->bytesFree = this->bytesFree + sVar1;
  }
  if (this_00 != (Block *)0x0) {
    sVar1 = Block::getFreeBytes(this_00,atype,huge_pages);
    this->bytesFree = this->bytesFree + sVar1;
  }
  if (this_01 != (Block *)0x0) {
    sVar1 = Block::getWastedBytes(this_01,atype,huge_pages);
    this->bytesWasted = this->bytesWasted + sVar1;
  }
  if (this_00 != (Block *)0x0) {
    sVar1 = Block::getWastedBytes(this_00,atype,huge_pages);
    this->bytesWasted = this->bytesWasted + sVar1;
  }
  return;
}

Assistant:

Statistics (FastAllocator* alloc, AllocationType atype, bool huge_pages = false)
      : bytesUsed(0), bytesFree(0), bytesWasted(0)
      {
        Block* usedBlocks = alloc->usedBlocks.load();
        Block* freeBlocks = alloc->freeBlocks.load();
        if (usedBlocks) bytesUsed += usedBlocks->getUsedBytes(atype,huge_pages);
        if (freeBlocks) bytesFree += freeBlocks->getAllocatedBytes(atype,huge_pages);
        if (usedBlocks) bytesFree += usedBlocks->getFreeBytes(atype,huge_pages);
        if (freeBlocks) bytesWasted += freeBlocks->getWastedBytes(atype,huge_pages);
        if (usedBlocks) bytesWasted += usedBlocks->getWastedBytes(atype,huge_pages);
      }